

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptFunctionCall
          (HlslGrammar *this,TSourceLoc *loc,TString *name,TIntermTyped **node,
          TIntermTyped *baseObject)

{
  bool bVar1;
  long *plVar2;
  ulong uVar3;
  TFunction *pTVar4;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  TFunction *this_00;
  TIntermTyped *pTVar5;
  TIntermTyped *local_e8;
  TIntermTyped *arguments;
  TFunction *local_48;
  TFunction *function;
  TString *functionName;
  TIntermTyped *baseObject_local;
  TIntermTyped **node_local;
  TString *name_local;
  TSourceLoc *loc_local;
  HlslGrammar *this_local;
  
  function = (TFunction *)0x0;
  pTVar4 = (TFunction *)name;
  functionName = (TString *)baseObject;
  baseObject_local = (TIntermTyped *)node;
  node_local = (TIntermTyped **)name;
  name_local = (TString *)loc;
  loc_local = (TSourceLoc *)this;
  if (baseObject != (TIntermTyped *)0x0) {
    bVar1 = HlslParseContext::isBuiltInMethod(this->parseContext,loc,baseObject,name);
    if (bVar1) {
      function = (TFunction *)NewPoolTString_abi_cxx11_("__BI_");
      loc = (TSourceLoc *)node_local;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)function,
             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             node_local);
      pTVar4 = function;
    }
    else {
      plVar2 = (long *)(*(code *)(functionName->_M_dataplus).super_allocator_type.allocator[2].
                                 inUseList)();
      uVar3 = (**(code **)(*plVar2 + 0x128))();
      if ((uVar3 & 1) == 0) {
        expected(this,"structure");
        return false;
      }
      pTVar4 = (TFunction *)NewPoolTString_abi_cxx11_("");
      function = pTVar4;
      plVar2 = (long *)(*(code *)(functionName->_M_dataplus).super_allocator_type.allocator[2].
                                 inUseList)();
      __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*plVar2 + 0x28))();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)pTVar4,
             __str);
      HlslParseContext::addScopeMangler(this->parseContext,(TString *)function);
      loc = (TSourceLoc *)node_local;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)function,
             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             node_local);
      pTVar4 = function;
    }
  }
  function = pTVar4;
  this_00 = (TFunction *)TSymbol::operator_new((TSymbol *)0x160,(size_t)loc);
  pTVar4 = function;
  TType::TType((TType *)&arguments,EbtVoid,EvqTemporary,1,0,0,false);
  TFunction::TFunction(this_00,(TString *)pTVar4,(TType *)&arguments,EOpNull);
  TType::~TType((TType *)&arguments);
  local_e8 = (TIntermTyped *)0x0;
  local_48 = this_00;
  if (functionName != (TString *)0x0) {
    HlslParseContext::handleFunctionArgument
              (this->parseContext,this_00,&local_e8,(TIntermTyped *)functionName);
  }
  bVar1 = acceptArguments(this,local_48,&local_e8);
  if (bVar1) {
    pTVar5 = HlslParseContext::handleFunctionCall
                       (this->parseContext,(TSourceLoc *)name_local,local_48,local_e8);
    (baseObject_local->super_TIntermNode)._vptr_TIntermNode = (_func_int **)pTVar5;
    this_local._7_1_ = (baseObject_local->super_TIntermNode)._vptr_TIntermNode != (_func_int **)0x0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptFunctionCall(const TSourceLoc& loc, TString& name, TIntermTyped*& node, TIntermTyped* baseObject)
{
    // name
    TString* functionName = nullptr;
    if (baseObject == nullptr) {
        functionName = &name;
    } else if (parseContext.isBuiltInMethod(loc, baseObject, name)) {
        // Built-in methods are not in the symbol table as methods, but as global functions
        // taking an explicit 'this' as the first argument.
        functionName = NewPoolTString(BUILTIN_PREFIX);
        functionName->append(name);
    } else {
        if (! baseObject->getType().isStruct()) {
            expected("structure");
            return false;
        }
        functionName = NewPoolTString("");
        functionName->append(baseObject->getType().getTypeName());
        parseContext.addScopeMangler(*functionName);
        functionName->append(name);
    }

    // function
    TFunction* function = new TFunction(functionName, TType(EbtVoid));

    // arguments
    TIntermTyped* arguments = nullptr;
    if (baseObject != nullptr) {
        // Non-static member functions have an implicit first argument of the base object.
        parseContext.handleFunctionArgument(function, arguments, baseObject);
    }
    if (! acceptArguments(function, arguments))
        return false;

    // call
    node = parseContext.handleFunctionCall(loc, function, arguments);

    return node != nullptr;
}